

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O0

bool __thiscall
CoreML::Specification::Int64ToDoubleMap::MergePartialFromCodedStream
          (Int64ToDoubleMap *this,CodedInputStream *input)

{
  uint32 tag_00;
  bool bVar1;
  int iVar2;
  WireType WVar3;
  pair<unsigned_int,_bool> pVar4;
  bool local_c1;
  int local_b0;
  undefined1 local_a0 [8];
  Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
  parser;
  pair<unsigned_int,_bool> p;
  uint32 tag;
  CodedInputStream *input_local;
  Int64ToDoubleMap *this_local;
  bool local_3d;
  uint32 local_3c [2];
  uint32 tag_1;
  bool at_or_below_cutoff;
  uint32 tag_3;
  uint32 kMax2ByteVarint;
  undefined4 local_24;
  uint32 tag_2;
  uint32 kMax1ByteVarint;
  uint32 first_byte_or_zero;
  uint32 local_10;
  uint uStack_c;
  
  do {
    while( true ) {
      kMax1ByteVarint = 0x7f;
      tag_2 = 0;
      _first_byte_or_zero = input;
      if ((input->buffer_ < input->buffer_end_) &&
         (tag_2 = (uint32)*input->buffer_, '\0' < (char)*input->buffer_)) {
        local_24 = 0x7f;
        kMax2ByteVarint = (uint32)*input->buffer_;
        google::protobuf::io::CodedInputStream::Advance(input,1);
        local_c1 = 0x7e < kMax1ByteVarint || kMax2ByteVarint <= kMax1ByteVarint;
        tag_3._3_1_ = local_c1;
        pVar4 = std::make_pair<unsigned_int&,bool>(&kMax2ByteVarint,(bool *)((long)&tag_3 + 3));
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      else {
        local_3c[0] = google::protobuf::io::CodedInputStream::ReadTagFallback(input,tag_2);
        local_3d = local_3c[0] - 1 < kMax1ByteVarint;
        pVar4 = std::make_pair<unsigned_int_const&,bool>(local_3c,&local_3d);
        local_10 = pVar4.first;
        uStack_c = CONCAT31(uStack_c._1_3_,pVar4.second);
      }
      tag_00 = local_10;
      parser.entry_.ptr_._4_4_ = local_10;
      if ((((uStack_c & 1) != 0) &&
          (iVar2 = google::protobuf::internal::WireFormatLite::GetTagFieldNumber(local_10),
          iVar2 == 1)) && ((tag_00 & 0xff) == 10)) break;
      if ((tag_00 == 0) ||
         (WVar3 = google::protobuf::internal::WireFormatLite::GetTagWireType(tag_00),
         WVar3 == WIRETYPE_END_GROUP)) {
        return true;
      }
      bVar1 = google::protobuf::internal::WireFormatLite::SkipField(input,tag_00);
      if (!bVar1) {
        return false;
      }
    }
    google::protobuf::internal::
    MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ::
    Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
    ::Parser((Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
              *)local_a0,&this->map_);
    bVar1 = google::protobuf::internal::WireFormatLite::
            ReadMessageNoVirtual<google::protobuf::internal::MapEntryImpl<google::protobuf::internal::MapEntryLite<long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::MessageLite,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>::Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,long,double,(google::protobuf::internal::WireFormatLite::FieldType)3,(google::protobuf::internal::WireFormatLite::FieldType)1,0>,google::protobuf::Map<long,double>>>
                      (input,(Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
                              *)local_a0);
    if (bVar1) {
      local_b0 = 0;
    }
    else {
      local_b0 = 6;
    }
    google::protobuf::internal::
    MapEntryImpl<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::MessageLite,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>
    ::
    Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
    ::~Parser((Parser<google::protobuf::internal::MapFieldLite<google::protobuf::internal::MapEntryLite<long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_long,_double,_(google::protobuf::internal::WireFormatLite::FieldType)3,_(google::protobuf::internal::WireFormatLite::FieldType)1,_0>,_google::protobuf::Map<long,_double>_>
               *)local_a0);
  } while (local_b0 == 0);
  return false;
}

Assistant:

bool Int64ToDoubleMap::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Int64ToDoubleMap)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // map<int64, double> map = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          Int64ToDoubleMap_MapEntry::Parser< ::google::protobuf::internal::MapFieldLite<
              Int64ToDoubleMap_MapEntry,
              ::google::protobuf::int64, double,
              ::google::protobuf::internal::WireFormatLite::TYPE_INT64,
              ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE,
              0 >,
            ::google::protobuf::Map< ::google::protobuf::int64, double > > parser(&map_);
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
              input, &parser));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Int64ToDoubleMap)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Int64ToDoubleMap)
  return false;
#undef DO_
}